

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildFieldOrExtension
          (DescriptorBuilder *this,FieldDescriptorProto *proto,Descriptor *parent,
          FieldDescriptor *result,bool is_extension,FlatAllocator *alloc)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  string_view sVar1;
  string_view sVar2;
  undefined1 auVar3 [16];
  FieldDescriptor *pFVar4;
  Descriptor *pDVar5;
  bool bVar6;
  int32_t iVar7;
  Edition EVar8;
  FieldDescriptorProto_Type FVar9;
  FieldDescriptorProto_Label FVar10;
  Type TVar11;
  CppType CVar12;
  int iVar13;
  string *psVar14;
  DescriptorNames *pDVar15;
  long lVar16;
  longlong lVar17;
  ulonglong uVar18;
  char *pcVar19;
  ulong uVar20;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>_>
  pMVar21;
  OneofDescriptor *pOVar22;
  uint *dest;
  AlphaNum *c;
  float fVar23;
  double dVar24;
  optional<google::protobuf::internal::DescriptorNames> oVar25;
  string_view source;
  string *local_380;
  Symbol local_368;
  string_view local_360;
  string_view local_350;
  string_view local_340;
  anon_class_16_2_0b95c8b9 local_330;
  VoidPtr local_320;
  Invoker<std::__cxx11::basic_string<char>_> local_318;
  string_view local_310;
  string_view local_300;
  string_view local_2f0;
  string_view local_2e0;
  anon_class_1_0_00000001 local_2c9;
  VoidPtr local_2c8;
  Invoker<std::__cxx11::basic_string<char>_> local_2c0;
  string_view local_2b8;
  string_view local_2a8;
  anon_class_8_1_a879b908 local_298;
  VoidPtr local_290;
  Invoker<std::__cxx11::basic_string<char>_> local_288;
  string_view local_280;
  string_view local_270;
  string_view local_260;
  undefined1 local_250 [16];
  undefined1 local_240 [8];
  string value;
  char *local_210;
  char *end_pos;
  anon_class_8_1_6971b95b local_1f8;
  VoidPtr local_1f0;
  Invoker<std::__cxx11::basic_string<char>_> local_1e8;
  string_view local_1e0;
  anon_class_8_1_6971b95b local_1d0;
  VoidPtr local_1c8;
  Invoker<std::__cxx11::basic_string<char>_> local_1c0;
  string_view local_1b8;
  string_view local_1a8;
  string_view local_198;
  string_view local_188;
  string_view local_178;
  _Storage<google::protobuf::internal::DescriptorNames,_true> local_168;
  undefined1 local_160;
  AlphaNum local_148;
  AlphaNum local_118;
  bool local_e8;
  undefined7 uStack_e7;
  size_t local_e0;
  AlphaNum local_d8;
  string local_a8;
  string_view local_88;
  size_t local_78;
  AlphaNum *local_70;
  string_view local_68;
  _Storage<google::protobuf::internal::DescriptorNames,_true> local_58;
  optional<google::protobuf::internal::DescriptorNames> names;
  string_view scope;
  FlatAllocator *alloc_local;
  FieldDescriptor *pFStack_28;
  bool is_extension_local;
  FieldDescriptor *result_local;
  Descriptor *parent_local;
  FieldDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  pFStack_28 = result;
  result_local = (FieldDescriptor *)parent;
  parent_local = (Descriptor *)proto;
  proto_local = (FieldDescriptorProto *)this;
  if (parent == (Descriptor *)0x0) {
    join_0x00000010_0x00000000_ = FileDescriptor::package(this->file_);
  }
  else {
    join_0x00000010_0x00000000_ = Descriptor::full_name(parent);
  }
  psVar14 = FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)parent_local);
  local_68 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar14);
  local_78 = names.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _8_8_;
  local_70 = (AlphaNum *)scope._M_len;
  bVar6 = FieldDescriptorProto::has_json_name((FieldDescriptorProto *)parent_local);
  if (bVar6) {
    local_380 = FieldDescriptorProto::json_name_abi_cxx11_((FieldDescriptorProto *)parent_local);
  }
  else {
    local_380 = (string *)0x0;
  }
  sVar1._M_str = (char *)local_70;
  sVar1._M_len = local_78;
  c = local_70;
  oVar25 = anon_unknown_24::
           FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::AllocateFieldNames
                     (&alloc->
                       super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                      ,local_68,sVar1,local_380);
  local_58 = oVar25.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _M_payload;
  names.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._M_payload._0_1_ =
       oVar25.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
       _M_engaged;
  bVar6 = std::optional::operator_cast_to_bool((optional *)&local_58._M_value);
  if (bVar6) {
    pDVar15 = std::optional<google::protobuf::internal::DescriptorNames>::operator*
                        ((optional<google::protobuf::internal::DescriptorNames> *)&local_58._M_value
                        );
    (pFStack_28->all_names_).payload_ = pDVar15->payload_;
  }
  else {
    bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       &names.
                        super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
                        _M_engaged);
    sVar1 = stack0xffffffffffffffb8;
    if (bVar6) {
      psVar14 = FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)parent_local);
      std::__cxx11::string::string((string *)&local_a8,(string *)psVar14);
    }
    else {
      local_e8 = names.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
                 _M_engaged;
      uStack_e7 = names.
                  super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
                  _M_payload.
                  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._9_7_;
      scope._M_len = (size_t)sVar1._M_str;
      local_e0 = scope._M_len;
      unique0x10002022 = sVar1;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_d8,sVar1);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_118,".");
      psVar14 = FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)parent_local);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_148,psVar14);
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_a8,(lts_20250127 *)&local_d8,&local_118,&local_148,c);
    }
    local_88 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a8);
    AddError(this,local_88,(Message *)parent_local,NAME,"Name too long.");
    std::__cxx11::string::~string((string *)&local_a8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_178,anon_var_dwarf_37cdd0 + 5);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,"unknown");
    oVar25 = anon_unknown_24::
             FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::AllocateEntityNames
                       (&alloc->
                         super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        ,local_178,local_188);
    local_168 = oVar25.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>
                ._M_payload.
                super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._M_payload
    ;
    local_160 = oVar25.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>
                ._M_payload.
                super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._M_engaged
    ;
    pDVar15 = std::optional<google::protobuf::internal::DescriptorNames>::value
                        ((optional<google::protobuf::internal::DescriptorNames> *)
                         &local_168._M_value);
    (pFStack_28->all_names_).payload_ = pDVar15->payload_;
  }
  psVar14 = FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)parent_local);
  local_198 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar14);
  local_1a8 = FieldDescriptor::full_name(pFStack_28);
  ValidateSymbolName(this,local_198,local_1a8,(Message *)parent_local);
  pFStack_28->file_ = this->file_;
  iVar7 = FieldDescriptorProto::number((FieldDescriptorProto *)parent_local);
  pFStack_28->number_ = iVar7;
  pFStack_28->field_0x1 = pFStack_28->field_0x1 & 0xf7 | is_extension << 3;
  pFStack_28->field_0x1 = pFStack_28->field_0x1 & 0xef;
  pFStack_28->field_0x3 = pFStack_28->field_0x3 & 0xfe;
  bVar6 = FieldDescriptorProto::proto3_optional((FieldDescriptorProto *)parent_local);
  pFStack_28->field_0x1 = pFStack_28->field_0x1 & 0xfd | bVar6 << 1;
  pFStack_28->field_0x3 = pFStack_28->field_0x3 & 0xf9 | 6;
  bVar6 = FieldDescriptorProto::proto3_optional((FieldDescriptorProto *)parent_local);
  if (bVar6) {
    EVar8 = FileDescriptor::edition(this->file_);
    if (EVar8 != EDITION_PROTO3) {
      local_1b8 = FieldDescriptor::full_name(pFStack_28);
      pDVar5 = parent_local;
      local_1d0.result = &stack0xffffffffffffffd8;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__0,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_1c8,&local_1d0);
      make_error.invoker_ = local_1c0;
      make_error.ptr_.obj = local_1c8.obj;
      AddError(this,local_1b8,(Message *)pDVar5,TYPE,make_error);
    }
  }
  bVar6 = FieldDescriptorProto::has_json_name((FieldDescriptorProto *)parent_local);
  pFStack_28->field_0x1 = pFStack_28->field_0x1 & 0xfb | bVar6 << 2;
  FVar9 = FieldDescriptorProto::type((FieldDescriptorProto *)parent_local);
  pFStack_28->type_ = (uint8_t)FVar9;
  FVar10 = FieldDescriptorProto::label((FieldDescriptorProto *)parent_local);
  pFStack_28->field_0x1 = pFStack_28->field_0x1 & 0x3f | (char)FVar10 << 6;
  pFStack_28->field_0x1 =
       pFStack_28->field_0x1 & 0xdf | ((byte)pFStack_28->field_0x1 >> 6 == 3) << 5;
  if (((byte)pFStack_28->field_0x1 >> 6 == 2) && (((byte)pFStack_28->field_0x1 >> 3 & 1) != 0)) {
    local_1e0 = FieldDescriptor::full_name(pFStack_28);
    pDVar5 = parent_local;
    local_1f8.result = &stack0xffffffffffffffd8;
    absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
    FunctionRef<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__1,void>
              ((FunctionRef<std::__cxx11::string()> *)&local_1f0,&local_1f8);
    make_error_00.invoker_ = local_1e8;
    make_error_00.ptr_.obj = local_1f0.obj;
    AddError(this,local_1e0,(Message *)pDVar5,TYPE,make_error_00);
  }
  pFStack_28->containing_type_ = (Descriptor *)0x0;
  pFStack_28->type_once_ = (once_flag *)0x0;
  (pFStack_28->field_20).default_value_int64_t_ = 0;
  bVar6 = FieldDescriptorProto::has_default_value((FieldDescriptorProto *)parent_local);
  pFStack_28->field_0x1 = pFStack_28->field_0x1 & 0xfe | bVar6;
  bVar6 = FieldDescriptorProto::has_default_value((FieldDescriptorProto *)parent_local);
  if (bVar6) {
    bVar6 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar6) {
      _end_pos = FieldDescriptor::full_name(pFStack_28);
      AddError(this,_end_pos,(Message *)parent_local,DEFAULT_VALUE,
               "Repeated fields can\'t have default values.");
    }
  }
  bVar6 = FieldDescriptorProto::has_type((FieldDescriptorProto *)parent_local);
  if (bVar6) {
    bVar6 = FieldDescriptorProto::has_default_value((FieldDescriptorProto *)parent_local);
    if (bVar6) {
      local_210 = (char *)0x0;
      CVar12 = FieldDescriptor::cpp_type(pFStack_28);
      auVar3._8_8_ = local_250._8_8_;
      auVar3._0_8_ = local_250._0_8_;
      sVar2._M_str = local_260._M_str;
      sVar2._M_len = local_260._M_len;
      dest = &switchD_018ebb87::switchdataD_02031cc0;
      switch(CVar12) {
      case CPPTYPE_INT32:
        FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)parent_local);
        pcVar19 = (char *)std::__cxx11::string::c_str();
        lVar16 = strtol(pcVar19,&local_210,0);
        (pFStack_28->field_20).default_value_int32_t_ = (int32_t)lVar16;
        break;
      case CPPTYPE_INT64:
        FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)parent_local);
        pcVar19 = (char *)std::__cxx11::string::c_str();
        lVar17 = strtoll(pcVar19,&local_210,0);
        (pFStack_28->field_20).default_value_int64_t_ = lVar17;
        break;
      case CPPTYPE_UINT32:
        FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)parent_local);
        pcVar19 = (char *)std::__cxx11::string::c_str();
        uVar20 = strtoul(pcVar19,&local_210,0);
        (pFStack_28->field_20).default_value_int32_t_ = (int32_t)uVar20;
        break;
      case CPPTYPE_UINT64:
        FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)parent_local);
        pcVar19 = (char *)std::__cxx11::string::c_str();
        uVar18 = strtoull(pcVar19,&local_210,0);
        (pFStack_28->field_20).default_value_uint64_t_ = uVar18;
        break;
      case CPPTYPE_DOUBLE:
        psVar14 = FieldDescriptorProto::default_value_abi_cxx11_
                            ((FieldDescriptorProto *)parent_local);
        bVar6 = std::operator==(psVar14,"inf");
        if (bVar6) {
          dVar24 = std::numeric_limits<double>::infinity();
          (pFStack_28->field_20).default_value_double_ = dVar24;
        }
        else {
          psVar14 = FieldDescriptorProto::default_value_abi_cxx11_
                              ((FieldDescriptorProto *)parent_local);
          bVar6 = std::operator==(psVar14,"-inf");
          if (bVar6) {
            dVar24 = std::numeric_limits<double>::infinity();
            (pFStack_28->field_20).default_value_uint64_t_ = (uint64_t)-dVar24;
          }
          else {
            psVar14 = FieldDescriptorProto::default_value_abi_cxx11_
                                ((FieldDescriptorProto *)parent_local);
            bVar6 = std::operator==(psVar14,"nan");
            if (bVar6) {
              dVar24 = std::numeric_limits<double>::quiet_NaN();
              (pFStack_28->field_20).default_value_double_ = dVar24;
            }
            else {
              FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)parent_local);
              pcVar19 = (char *)std::__cxx11::string::c_str();
              dVar24 = protobuf::io::NoLocaleStrtod(pcVar19,&local_210);
              (pFStack_28->field_20).default_value_double_ = dVar24;
            }
          }
        }
        break;
      case CPPTYPE_FLOAT:
        psVar14 = FieldDescriptorProto::default_value_abi_cxx11_
                            ((FieldDescriptorProto *)parent_local);
        bVar6 = std::operator==(psVar14,"inf");
        if (bVar6) {
          fVar23 = std::numeric_limits<float>::infinity();
          (pFStack_28->field_20).default_value_float_ = fVar23;
        }
        else {
          psVar14 = FieldDescriptorProto::default_value_abi_cxx11_
                              ((FieldDescriptorProto *)parent_local);
          bVar6 = std::operator==(psVar14,"-inf");
          if (bVar6) {
            fVar23 = std::numeric_limits<float>::infinity();
            (pFStack_28->field_20).default_value_uint32_t_ = (uint32_t)-fVar23;
          }
          else {
            psVar14 = FieldDescriptorProto::default_value_abi_cxx11_
                                ((FieldDescriptorProto *)parent_local);
            bVar6 = std::operator==(psVar14,"nan");
            if (bVar6) {
              fVar23 = std::numeric_limits<float>::quiet_NaN();
              (pFStack_28->field_20).default_value_float_ = fVar23;
            }
            else {
              FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)parent_local);
              pcVar19 = (char *)std::__cxx11::string::c_str();
              dVar24 = protobuf::io::NoLocaleStrtod(pcVar19,&local_210);
              fVar23 = protobuf::io::SafeDoubleToFloat(dVar24);
              (pFStack_28->field_20).default_value_float_ = fVar23;
            }
          }
        }
        break;
      case CPPTYPE_BOOL:
        psVar14 = FieldDescriptorProto::default_value_abi_cxx11_
                            ((FieldDescriptorProto *)parent_local);
        bVar6 = std::operator==(psVar14,"true");
        if (bVar6) {
          (pFStack_28->field_20).default_value_bool_ = true;
        }
        else {
          psVar14 = FieldDescriptorProto::default_value_abi_cxx11_
                              ((FieldDescriptorProto *)parent_local);
          bVar6 = std::operator==(psVar14,"false");
          if (bVar6) {
            (pFStack_28->field_20).default_value_bool_ = false;
          }
          else {
            join_0x00000010_0x00000000_ = FieldDescriptor::full_name(pFStack_28);
            AddError(this,join_0x00000010_0x00000000_,(Message *)parent_local,DEFAULT_VALUE,
                     "Boolean default must be true or false.");
          }
        }
        break;
      case CPPTYPE_ENUM:
        (pFStack_28->field_20).default_value_int64_t_ = 0;
        local_260 = sVar2;
        local_250 = auVar3;
        break;
      case CPPTYPE_STRING:
        TVar11 = FieldDescriptor::type(pFStack_28);
        if (TVar11 == TYPE_BYTES) {
          std::__cxx11::string::string((string *)local_240);
          psVar14 = FieldDescriptorProto::default_value_abi_cxx11_
                              ((FieldDescriptorProto *)parent_local);
          local_250 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar14);
          source._M_str = local_240;
          source._M_len = local_250._8_8_;
          bVar6 = absl::lts_20250127::CUnescape(local_250._0_8_,source,(Nonnull<std::string_*>)dest)
          ;
          if (bVar6) {
            psVar14 = protobuf::(anonymous_namespace)::
                      FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                      ::AllocateStrings<std::__cxx11::string&>
                                ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                                  *)alloc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_240);
            (pFStack_28->field_20).default_value_string_ = psVar14;
          }
          else {
            local_260 = FieldDescriptor::full_name(pFStack_28);
            AddError(this,local_260,(Message *)parent_local,DEFAULT_VALUE,
                     "Invalid escaping in default value.");
          }
          std::__cxx11::string::~string((string *)local_240);
        }
        else {
          psVar14 = FieldDescriptorProto::default_value_abi_cxx11_
                              ((FieldDescriptorProto *)parent_local);
          psVar14 = protobuf::(anonymous_namespace)::
                    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    ::AllocateStrings<std::__cxx11::string_const&>
                              ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                                *)alloc,psVar14);
          (pFStack_28->field_20).default_value_string_ = psVar14;
        }
        break;
      case CPPTYPE_MESSAGE:
        local_270 = FieldDescriptor::full_name(pFStack_28);
        AddError(this,local_270,(Message *)parent_local,DEFAULT_VALUE,
                 "Messages can\'t have default values.");
        pFStack_28->field_0x1 = pFStack_28->field_0x1 & 0xfe;
        std::atomic<const_google::protobuf::Message_*>::operator=
                  (&(pFStack_28->field_20).default_generated_instance_,(__pointer_type)0x0);
      }
      if (local_210 != (char *)0x0) {
        FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)parent_local);
        uVar20 = std::__cxx11::string::empty();
        if (((uVar20 & 1) != 0) || (*local_210 != '\0')) {
          local_280 = FieldDescriptor::full_name(pFStack_28);
          pDVar5 = parent_local;
          local_298.proto = (FieldDescriptorProto *)parent_local;
          absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
          FunctionRef<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__2,void>
                    ((FunctionRef<std::__cxx11::string()> *)&local_290,&local_298);
          make_error_01.invoker_ = local_288;
          make_error_01.ptr_.obj = local_290.obj;
          AddError(this,local_280,(Message *)pDVar5,DEFAULT_VALUE,make_error_01);
        }
      }
    }
    else {
      CVar12 = FieldDescriptor::cpp_type(pFStack_28);
      switch(CVar12) {
      case CPPTYPE_INT32:
        (pFStack_28->field_20).default_value_int32_t_ = 0;
        break;
      case CPPTYPE_INT64:
        (pFStack_28->field_20).default_value_int64_t_ = 0;
        break;
      case CPPTYPE_UINT32:
        (pFStack_28->field_20).default_value_int32_t_ = 0;
        break;
      case CPPTYPE_UINT64:
        (pFStack_28->field_20).default_value_int64_t_ = 0;
        break;
      case CPPTYPE_DOUBLE:
        (pFStack_28->field_20).default_value_int64_t_ = 0;
        break;
      case CPPTYPE_FLOAT:
        (pFStack_28->field_20).default_value_int32_t_ = 0;
        break;
      case CPPTYPE_BOOL:
        (pFStack_28->field_20).default_value_bool_ = false;
        break;
      case CPPTYPE_ENUM:
        (pFStack_28->field_20).default_value_int64_t_ = 0;
        break;
      case CPPTYPE_STRING:
        psVar14 = internal::GetEmptyString_abi_cxx11_();
        (pFStack_28->field_20).default_value_string_ = psVar14;
        break;
      case CPPTYPE_MESSAGE:
        std::atomic<const_google::protobuf::Message_*>::operator=
                  (&(pFStack_28->field_20).default_generated_instance_,(__pointer_type)0x0);
      }
    }
  }
  iVar13 = FieldDescriptor::number(pFStack_28);
  if (iVar13 < 1) {
    pMVar21 = absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
              ::
              operator[]<google::protobuf::Descriptor*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>>
                        ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                          *)&this->message_hints_,
                         (key_arg<google::protobuf::Descriptor_*> *)&result_local);
    MessageHints::RequestHintOnFieldNumbers(pMVar21,(Message *)parent_local,NUMBER,0,1);
    local_2a8 = FieldDescriptor::full_name(pFStack_28);
    AddError(this,local_2a8,(Message *)parent_local,NUMBER,
             "Field numbers must be positive integers.");
  }
  else if (!is_extension) {
    iVar13 = FieldDescriptor::number(pFStack_28);
    if (0x1fffffff < iVar13) {
      pMVar21 = absl::lts_20250127::container_internal::
                raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                ::
                operator[]<google::protobuf::Descriptor*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>>
                          ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                            *)&this->message_hints_,
                           (key_arg<google::protobuf::Descriptor_*> *)&result_local);
      MessageHints::RequestHintOnFieldNumbers(pMVar21,(Message *)parent_local,NUMBER,0,1);
      local_2b8 = FieldDescriptor::full_name(pFStack_28);
      pDVar5 = parent_local;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__3,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_2c8,&local_2c9);
      make_error_02.invoker_ = local_2c0;
      make_error_02.ptr_.obj = local_2c8.obj;
      AddError(this,local_2b8,(Message *)pDVar5,NUMBER,make_error_02);
    }
  }
  if (is_extension) {
    bVar6 = FieldDescriptorProto::has_extendee((FieldDescriptorProto *)parent_local);
    if (!bVar6) {
      local_2e0 = FieldDescriptor::full_name(pFStack_28);
      AddError(this,local_2e0,(Message *)parent_local,EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }
    (pFStack_28->scope_).containing_oneof = (OneofDescriptor *)result_local;
    bVar6 = FieldDescriptorProto::has_oneof_index((FieldDescriptorProto *)parent_local);
    if (bVar6) {
      local_2f0 = FieldDescriptor::full_name(pFStack_28);
      AddError(this,local_2f0,(Message *)parent_local,TYPE,
               "FieldDescriptorProto.oneof_index should not be set for extensions.");
    }
  }
  else {
    bVar6 = FieldDescriptorProto::has_extendee((FieldDescriptorProto *)parent_local);
    if (bVar6) {
      local_300 = FieldDescriptor::full_name(pFStack_28);
      AddError(this,local_300,(Message *)parent_local,EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }
    pFStack_28->containing_type_ = (Descriptor *)result_local;
    bVar6 = FieldDescriptorProto::has_oneof_index((FieldDescriptorProto *)parent_local);
    if (bVar6) {
      iVar7 = FieldDescriptorProto::oneof_index((FieldDescriptorProto *)parent_local);
      if (-1 < iVar7) {
        iVar7 = FieldDescriptorProto::oneof_index((FieldDescriptorProto *)parent_local);
        iVar13 = Descriptor::oneof_decl_count((Descriptor *)result_local);
        pFVar4 = result_local;
        if (iVar7 < iVar13) {
          pFStack_28->field_0x1 = pFStack_28->field_0x1 & 0xef | 0x10;
          iVar7 = FieldDescriptorProto::oneof_index((FieldDescriptorProto *)parent_local);
          pOVar22 = Descriptor::oneof_decl((Descriptor *)pFVar4,iVar7);
          (pFStack_28->scope_).containing_oneof = pOVar22;
          pFStack_28->field_0x3 =
               pFStack_28->field_0x3 & 0xfe | ((byte)pFStack_28->field_0x1 >> 1 & 1 ^ 0xff) & 1;
          goto LAB_018ec57b;
        }
      }
      local_310 = FieldDescriptor::full_name(pFStack_28);
      pDVar5 = parent_local;
      local_330.proto = (FieldDescriptorProto *)parent_local;
      local_330.parent = (Descriptor **)&result_local;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__4,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_320,&local_330);
      make_error_03.invoker_ = local_318;
      make_error_03.ptr_.obj = local_320.obj;
      AddError(this,local_310,(Message *)pDVar5,TYPE,make_error_03);
    }
  }
LAB_018ec57b:
  pDVar5 = parent_local;
  pFVar4 = pFStack_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_340,"google.protobuf.FieldOptions");
  AllocateOptions<google::protobuf::FieldDescriptor>(this,(Proto *)pDVar5,pFVar4,8,local_340,alloc);
  local_350 = FieldDescriptor::full_name(pFStack_28);
  pFVar4 = result_local;
  local_360 = FieldDescriptor::name(pFStack_28);
  pDVar5 = parent_local;
  Symbol::Symbol(&local_368,pFStack_28);
  AddSymbol(this,local_350,pFVar4,local_360,(Message *)pDVar5,local_368);
  return;
}

Assistant:

void DescriptorBuilder::BuildFieldOrExtension(const FieldDescriptorProto& proto,
                                              Descriptor* parent,
                                              FieldDescriptor* result,
                                              bool is_extension,
                                              internal::FlatAllocator& alloc) {
  const absl::string_view scope =
      (parent == nullptr) ? file_->package() : parent->full_name();

  // We allocate all names in a single array, and dedup them.
  if (auto names = alloc.AllocateFieldNames(
          proto.name(), scope,
          proto.has_json_name() ? &proto.json_name() : nullptr)) {
    result->all_names_ = *names;
  } else {
    AddError(
        scope.empty() ? proto.name() : absl::StrCat(scope, ".", proto.name()),
        proto, DescriptorPool::ErrorCollector::NAME, "Name too long.");
    result->all_names_ = alloc.AllocateEntityNames("", "unknown").value();
  }

  ValidateSymbolName(proto.name(), result->full_name(), proto);

  result->file_ = file_;
  result->number_ = proto.number();
  result->is_extension_ = is_extension;
  result->is_oneof_ = false;
  result->in_real_oneof_ = false;
  result->proto3_optional_ = proto.proto3_optional();
  result->legacy_proto_ctype_ = FieldOptions::CType_MAX + 1;

  if (proto.proto3_optional() && file_->edition() != Edition::EDITION_PROTO3) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             [&] {
               return absl::StrCat(
                   "The [proto3_optional=true] option may only be set on proto3"
                   "fields, not ",
                   result->full_name());
             });
  }

  result->has_json_name_ = proto.has_json_name();

  result->type_ = proto.type();
  result->label_ = proto.label();
  result->is_repeated_ = result->label_ == FieldDescriptor::LABEL_REPEATED;

  if (result->label_ == FieldDescriptor::LABEL_REQUIRED) {
    // An extension cannot have a required field (b/13365836).
    if (result->is_extension_) {
      AddError(result->full_name(), proto,
               // Error location `TYPE`: we would really like to indicate
               // `LABEL`, but the `ErrorLocation` enum has no entry for this,
               // and we don't necessarily know about all implementations of the
               // `ErrorCollector` interface to extend them to handle the new
               // error location type properly.
               DescriptorPool::ErrorCollector::TYPE, [&] {
                 return absl::StrCat("The extension ", result->full_name(),
                                     " cannot be required.");
               });
    }
  }

  // Some of these may be filled in when cross-linking.
  result->containing_type_ = nullptr;
  result->type_once_ = nullptr;
  result->default_value_enum_ = nullptr;

  result->has_default_value_ = proto.has_default_value();
  if (proto.has_default_value() && result->is_repeated()) {
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Repeated fields can't have default values.");
  }

  if (proto.has_type()) {
    if (proto.has_default_value()) {
      char* end_pos = nullptr;
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_t_ =
              std::strtol(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          static_assert(sizeof(int64_t) == sizeof(long long),  // NOLINT
                        "sizeof int64_t is not sizeof long long");
          result->default_value_int64_t_ =
              std::strtoll(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_t_ =
              std::strtoul(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          static_assert(
              sizeof(uint64_t) == sizeof(unsigned long long),  // NOLINT
              "sizeof uint64_t is not sizeof unsigned long long");
          result->default_value_uint64_t_ =
              std::strtoull(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          if (proto.default_value() == "inf") {
            result->default_value_float_ =
                std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_float_ =
                -std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_float_ =
                std::numeric_limits<float>::quiet_NaN();
          } else {
            result->default_value_float_ = io::SafeDoubleToFloat(
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos));
          }
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          if (proto.default_value() == "inf") {
            result->default_value_double_ =
                std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_double_ =
                -std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_double_ =
                std::numeric_limits<double>::quiet_NaN();
          } else {
            result->default_value_double_ =
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          if (proto.default_value() == "true") {
            result->default_value_bool_ = true;
          } else if (proto.default_value() == "false") {
            result->default_value_bool_ = false;
          } else {
            AddError(result->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Boolean default must be true or false.");
          }
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = nullptr;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          if (result->type() == FieldDescriptor::TYPE_BYTES) {
            std::string value;
            if (absl::CUnescape(proto.default_value(), &value)) {
              result->default_value_string_ = alloc.AllocateStrings(value);
            } else {
              AddError(result->full_name(), proto,
                       DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                       "Invalid escaping in default value.");
            }
          } else {
            result->default_value_string_ =
                alloc.AllocateStrings(proto.default_value());
          }
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Messages can't have default values.");
          result->has_default_value_ = false;
          result->default_generated_instance_ = nullptr;
          break;
      }

      if (end_pos != nullptr) {
        // end_pos is only set non-null by the parsers for numeric types,
        // above. This checks that the default was non-empty and had no extra
        // junk after the end of the number.
        if (proto.default_value().empty() || *end_pos != '\0') {
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE, [&] {
                     return absl::StrCat("Couldn't parse default value \"",
                                         proto.default_value(), "\".");
                   });
        }
      }
    } else {
      // No explicit default value
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          result->default_value_float_ = 0.0f;
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          result->default_value_double_ = 0.0;
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          result->default_value_bool_ = false;
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = nullptr;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          result->default_value_string_ = &internal::GetEmptyString();
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          result->default_generated_instance_ = nullptr;
          break;
      }
    }
  }

  if (result->number() <= 0) {
    message_hints_[parent].RequestHintOnFieldNumbers(
        proto, DescriptorPool::ErrorCollector::NUMBER);
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Field numbers must be positive integers.");
  } else if (!is_extension && result->number() > FieldDescriptor::kMaxNumber) {
    // Only validate that the number is within the valid field range if it is
    // not an extension. Since extension numbers are validated with the
    // extendee's valid set of extension numbers, and those are in turn
    // validated against the max allowed number, the check is unnecessary for
    // extension fields.
    // This avoids cross-linking issues that arise when attempting to check if
    // the extendee is a message_set_wire_format message, which has a higher max
    // on extension numbers.
    message_hints_[parent].RequestHintOnFieldNumbers(
        proto, DescriptorPool::ErrorCollector::NUMBER);
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             [&] {
               return absl::Substitute(
                   "Field numbers cannot be greater than $0.",
                   FieldDescriptor::kMaxNumber);
             });
  }

  if (is_extension) {
    if (!proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }

    result->scope_.extension_scope = parent;

    if (proto.has_oneof_index()) {
      AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "FieldDescriptorProto.oneof_index should not be set for "
               "extensions.");
    }
  } else {
    if (proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }

    result->containing_type_ = parent;

    if (proto.has_oneof_index()) {
      if (proto.oneof_index() < 0 ||
          proto.oneof_index() >= parent->oneof_decl_count()) {
        AddError(result->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE, [&] {
                   return absl::Substitute(
                       "FieldDescriptorProto.oneof_index $0 is "
                       "out of range for type \"$1\".",
                       proto.oneof_index(), parent->name());
                 });
      } else {
        result->is_oneof_ = true;
        result->scope_.containing_oneof =
            parent->oneof_decl(proto.oneof_index());
        result->in_real_oneof_ = !result->proto3_optional_;
      }
    }
  }

  // Copy options.
  AllocateOptions(proto, result, FieldDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.FieldOptions", alloc);

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));
}